

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O3

void __thiscall tinyjson::json_node::~json_node(json_node *this)

{
  pointer *pppjVar1;
  node_type nVar2;
  pointer ppjVar3;
  json_node *pjVar4;
  ulong uVar5;
  object *this_00;
  object *poVar6;
  pointer ppjVar7;
  
  nVar2 = this->type;
  if (nVar2 != object_type) {
    if (nVar2 != array_type) {
      if (nVar2 != string_type) {
        return;
      }
      this_00 = (object *)(this->storage).array_val;
      if (this_00 != (object *)0x0) {
        ppjVar7 = (((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                   &this_00->linked_list)->_M_impl).super__Vector_impl_data._M_start;
        pppjVar1 = &(((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *
                      )&this_00->linked_list)->_M_impl).super__Vector_impl_data._M_end_of_storage;
        if (ppjVar7 != (pointer)pppjVar1) {
          operator_delete(ppjVar7,(long)*pppjVar1 + 1);
        }
      }
      uVar5 = 0x20;
      goto LAB_00102d7d;
    }
    this_00 = (this->storage).object_val;
    ppjVar7 = (((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
               &this_00->linked_list)->_M_impl).super__Vector_impl_data._M_start;
    ppjVar3 = (((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
               &this_00->linked_list)->_M_impl).super__Vector_impl_data._M_finish;
    if (ppjVar7 == ppjVar3) {
LAB_00102cf5:
      if (ppjVar7 != (pointer)0x0) {
        operator_delete(ppjVar7,(long)(((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                                         *)&this_00->linked_list)->_M_impl).super__Vector_impl_data.
                                      _M_end_of_storage - (long)ppjVar7);
      }
    }
    else {
      do {
        pjVar4 = *ppjVar7;
        if (pjVar4 != (json_node *)0x0) {
          ~json_node(pjVar4);
        }
        operator_delete(pjVar4,0x10);
        ppjVar7 = ppjVar7 + 1;
      } while (ppjVar7 != ppjVar3);
      this_00 = (object *)(this->storage).array_val;
      if (this_00 != (object *)0x0) {
        ppjVar7 = (((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                   &this_00->linked_list)->_M_impl).super__Vector_impl_data._M_start;
        goto LAB_00102cf5;
      }
      this_00 = (object *)0x0;
    }
    uVar5 = 0x18;
    goto LAB_00102d7d;
  }
  this_00 = (object *)(this->storage).array_val;
  poVar6 = (object *)
           (this_00->linked_list).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (poVar6 == this_00) {
LAB_00102d46:
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(this_00->hash_map)._M_h);
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
    ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                *)this_00);
  }
  else {
    do {
      pjVar4 = (json_node *)(poVar6->hash_map)._M_h._M_element_count;
      if (pjVar4 != (json_node *)0x0) {
        ~json_node(pjVar4);
      }
      operator_delete(pjVar4,0x10);
      poVar6 = (object *)
               (poVar6->linked_list).
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    } while (poVar6 != this_00);
    this_00 = (object *)(this->storage).array_val;
    if (this_00 != (object *)0x0) goto LAB_00102d46;
    this_00 = (object *)0x0;
  }
  uVar5 = 0x50;
LAB_00102d7d:
  operator_delete(this_00,uVar5);
  return;
}

Assistant:

~json_node() {
      clear();
    }